

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_35995e::StaleFileRemovalCommand::execute
          (StaleFileRemovalCommand *this,BuildSystem *system,TaskInterface ti,
          QueueJobContext *context,ResultFn *resultFn)

{
  size_type *psVar1;
  pointer pcVar2;
  bool bVar3;
  char cVar4;
  long lVar5;
  pointer pbVar6;
  BuildEngineDelegate *pBVar7;
  long *plVar8;
  int *piVar9;
  long *plVar10;
  long *plVar11;
  undefined8 *puVar12;
  pointer pbVar13;
  undefined8 uVar14;
  _Alloc_hider _Var15;
  bool bVar16;
  ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> values;
  ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  values_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> root;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fileToDelete;
  TaskInterface local_1a8;
  long local_198;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  BuildSystem *local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  StaleFileRemovalCommand *local_160;
  pointer local_158;
  pointer local_150;
  long *local_148;
  long local_140;
  long local_138;
  long lStack_130;
  _Any_data *local_128;
  long *local_120;
  void *local_118;
  string *local_110;
  pointer local_108;
  string local_100;
  BuildValue local_e0;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_118 = ti.ctx;
  local_120 = (long *)ti.impl;
  local_188 = system;
  if ((this->hasPriorResult == true) && ((this->priorValue).kind == StaleFileRemoval)) {
    local_128 = (_Any_data *)resultFn;
    computeFilesToDelete(this);
    plVar11 = *(long **)((long)local_188->impl + 8);
    (**(code **)(*plVar11 + 0x50))(plVar11,this);
    pbVar13 = (this->filesToDelete).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_108 = (this->filesToDelete).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar13 != local_108) {
      local_110 = &this->pathSeparators;
      local_160 = this;
      do {
        local_e0._0_8_ = &local_e0.valueData;
        pcVar2 = (pbVar13->_M_dataplus)._M_p;
        local_158 = pbVar13;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e0,pcVar2,pcVar2 + pbVar13->_M_string_length);
        pbVar13 = (this->roots).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar6 = (this->roots).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar16 = pbVar6 == pbVar13;
        if (bVar16) {
LAB_00194d31:
          local_150 = pbVar6;
          if (pbVar13 != pbVar6) {
            do {
              pcVar2 = (pbVar13->_M_dataplus)._M_p;
              local_1a8.impl = &local_198;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1a8,pcVar2,pcVar2 + pbVar13->_M_string_length);
              local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_100,local_e0._0_8_,
                         (char *)(local_e0._0_8_ + local_e0.signature.value));
              local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_70,local_1a8.impl,
                         (long)local_1a8.ctx + (long)local_1a8.impl);
              bVar3 = llbuild::buildsystem::pathIsPrefixedByPath(&local_100,&local_70);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100._M_dataplus._M_p != &local_100.field_2) {
                operator_delete(local_100._M_dataplus._M_p,
                                local_100.field_2._M_allocated_capacity + 1);
              }
              if ((long *)local_1a8.impl != &local_198) {
                operator_delete(local_1a8.impl,local_198 + 1);
              }
              bVar16 = (bool)(bVar16 | bVar3);
              pbVar13 = pbVar13 + 1;
            } while (pbVar13 != local_150);
          }
          if (bVar16 == false) {
            plVar10 = *(long **)((long)local_188->impl + 8);
            std::operator+(&local_180,"Stale file \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_e0);
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_180);
            plVar11 = plVar8 + 2;
            if ((long *)*plVar8 == plVar11) {
              local_198 = *plVar11;
              uStack_190 = (undefined4)plVar8[3];
              uStack_18c = *(undefined4 *)((long)plVar8 + 0x1c);
              local_1a8.impl = &local_198;
            }
            else {
              local_198 = *plVar11;
              local_1a8.impl = (long *)*plVar8;
            }
            goto LAB_00195053;
          }
          local_1a8.impl = local_120;
          local_1a8.ctx = local_118;
          pBVar7 = llbuild::core::TaskInterface::delegate(&local_1a8);
          cVar4 = (**(code **)(*(long *)pBVar7[1]._vptr_BuildEngineDelegate[2] + 0x28))
                            (pBVar7[1]._vptr_BuildEngineDelegate[2],
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_e0);
          pbVar13 = local_158;
          this = local_160;
          if (cVar4 != '\0') {
            plVar10 = *(long **)((long)local_188->impl + 8);
            std::operator+(&local_180,"Removed stale file \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_e0);
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_180);
            plVar11 = plVar8 + 2;
            if ((long *)*plVar8 == plVar11) {
              local_198 = *plVar11;
              uStack_190 = (undefined4)plVar8[3];
              uStack_18c = *(undefined4 *)((long)plVar8 + 0x1c);
              local_1a8.impl = &local_198;
            }
            else {
              local_198 = *plVar11;
              local_1a8.impl = (long *)*plVar8;
            }
            local_1a8.ctx = (void *)plVar8[1];
            *plVar8 = (long)plVar11;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            (**(code **)(*plVar10 + 0x60))(plVar10,this,local_1a8.impl,local_1a8.ctx);
            goto LAB_001950b7;
          }
          piVar9 = __errno_location();
          if (*piVar9 != 2) {
            local_150 = *(pointer *)((long)local_188->impl + 8);
            std::operator+(&local_50,"cannot remove stale file \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_e0);
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
            local_148 = &local_138;
            plVar11 = plVar10 + 2;
            if ((long *)*plVar10 == plVar11) {
              local_138 = *plVar11;
              lStack_130 = plVar10[3];
            }
            else {
              local_138 = *plVar11;
              local_148 = (long *)*plVar10;
            }
            local_140 = plVar10[1];
            *plVar10 = (long)plVar11;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            strerror(*piVar9);
            plVar11 = (long *)std::__cxx11::string::append((char *)&local_148);
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            psVar1 = (size_type *)(plVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar1) {
              local_180.field_2._M_allocated_capacity = *psVar1;
              local_180.field_2._8_8_ = plVar11[3];
            }
            else {
              local_180.field_2._M_allocated_capacity = *psVar1;
              local_180._M_dataplus._M_p = (pointer)*plVar11;
            }
            local_180._M_string_length = plVar11[1];
            *plVar11 = (long)psVar1;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
            plVar11 = puVar12 + 2;
            if ((long *)*puVar12 == plVar11) {
              local_198 = *plVar11;
              uStack_190 = *(undefined4 *)(puVar12 + 3);
              uStack_18c = *(undefined4 *)((long)puVar12 + 0x1c);
              local_1a8.impl = &local_198;
            }
            else {
              local_198 = *plVar11;
              local_1a8.impl = (long *)*puVar12;
            }
            local_1a8.ctx = (void *)puVar12[1];
            *puVar12 = plVar11;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
            (**(code **)((local_150->_M_dataplus)._M_p + 0x68))
                      (local_150,this,local_1a8.impl,local_1a8.ctx);
            if ((long *)local_1a8.impl != &local_198) {
              operator_delete(local_1a8.impl,local_198 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_148 != &local_138) {
              operator_delete(local_148,local_138 + 1);
            }
            uVar14 = local_50.field_2._M_allocated_capacity;
            _Var15._M_p = local_50._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_001950e9;
            goto LAB_001950e1;
          }
        }
        else {
          lVar5 = std::__cxx11::string::find
                            ((char)local_110,(ulong)(uint)(int)*(char *)local_e0._0_8_);
          if (lVar5 != -1) {
            pbVar13 = (local_160->roots).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pbVar6 = (local_160->roots).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            goto LAB_00194d31;
          }
          plVar10 = *(long **)((long)local_188->impl + 8);
          std::operator+(&local_180,"Stale file \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_e0);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_180);
          plVar11 = plVar8 + 2;
          if ((long *)*plVar8 == plVar11) {
            local_198 = *plVar11;
            uStack_190 = (undefined4)plVar8[3];
            uStack_18c = *(undefined4 *)((long)plVar8 + 0x1c);
            local_1a8.impl = &local_198;
          }
          else {
            local_198 = *plVar11;
            local_1a8.impl = (long *)*plVar8;
          }
LAB_00195053:
          pbVar13 = local_158;
          this = local_160;
          local_1a8.ctx = (void *)plVar8[1];
          *plVar8 = (long)plVar11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          (**(code **)(*plVar10 + 0x68))(plVar10,local_160,local_1a8.impl,local_1a8.ctx);
LAB_001950b7:
          if ((long *)local_1a8.impl != &local_198) {
            operator_delete(local_1a8.impl,local_198 + 1);
          }
          uVar14 = local_180.field_2._M_allocated_capacity;
          _Var15._M_p = local_180._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
LAB_001950e1:
            operator_delete(_Var15._M_p,uVar14 + 1);
          }
        }
LAB_001950e9:
        if ((anon_union_80_2_ecfed234_for_valueData *)local_e0._0_8_ != &local_e0.valueData) {
          operator_delete((void *)local_e0._0_8_,local_e0.valueData.asOutputInfo.device + 1);
        }
        pbVar13 = pbVar13 + 1;
      } while (pbVar13 != local_108);
    }
    plVar11 = *(long **)((long)local_188->impl + 8);
    (**(code **)(*plVar11 + 0x70))(plVar11,this,0);
    pbVar13 = (this->expectedOutputs).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    values_00.Length =
         (long)(this->expectedOutputs).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar13 >> 5;
    values_00.Data = pbVar13;
    llbuild::buildsystem::BuildValue::BuildValue(&local_e0,StaleFileRemoval,values_00);
    if (*(long *)(local_128 + 1) == 0) {
LAB_00195357:
      std::__throw_bad_function_call();
    }
    (**(code **)(local_128->_M_pod_data + 0x18))(local_128,&local_e0);
  }
  else {
    plVar11 = *(long **)((long)system->impl + 8);
    (**(code **)(*plVar11 + 0x50))(plVar11,this);
    plVar11 = *(long **)((long)system->impl + 8);
    (**(code **)(*plVar11 + 0x70))(plVar11,this,0);
    pbVar13 = (this->expectedOutputs).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    values.Length =
         (long)(this->expectedOutputs).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar13 >> 5;
    values.Data = pbVar13;
    llbuild::buildsystem::BuildValue::BuildValue(&local_e0,StaleFileRemoval,values);
    if ((resultFn->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00195357;
    (*resultFn->_M_invoker)((_Any_data *)resultFn,&local_e0);
  }
  llbuild::buildsystem::BuildValue::~BuildValue(&local_e0);
  return;
}

Assistant:

virtual void execute(BuildSystem& system,
                       TaskInterface ti,
                       QueueJobContext* context,
                       ResultFn resultFn) override {
    // Nothing to do if we do not have a prior result.
    if (!hasPriorResult || !priorValue.isStaleFileRemoval()) {
      system.getDelegate().commandStarted(this);
      system.getDelegate().commandFinished(this, ProcessStatus::Succeeded);
      resultFn(BuildValue::makeStaleFileRemoval(expectedOutputs));
      return;
    }

    computeFilesToDelete();

    system.getDelegate().commandStarted(this);

    for (auto fileToDelete : filesToDelete) {
      // If no root paths are specified, any path is valid.
      bool isLocatedUnderRootPath = roots.size() == 0 ? true : false;

      // If root paths are defined, stale file paths should be absolute.
      if (roots.size() > 0 &&
          pathSeparators.find(fileToDelete[0]) == std::string::npos) {
        system.getDelegate().commandHadWarning(this, "Stale file '" + fileToDelete + "' has a relative path. This is invalid in combination with the root path attribute.\n");
        continue;
      }

      // Check if the file is located under one of the allowed root paths.
      for (auto root : roots) {
        if (pathIsPrefixedByPath(fileToDelete, root)) {
          isLocatedUnderRootPath = true;
        }
      }

      if (!isLocatedUnderRootPath) {
        system.getDelegate().commandHadWarning(this, "Stale file '" + fileToDelete + "' is located outside of the allowed root paths.\n");
        continue;
      }

      if (getBuildSystem(ti).getFileSystem().remove(fileToDelete)) {
        system.getDelegate().commandHadNote(this, "Removed stale file '" + fileToDelete + "'\n");
      } else {
        // Do not warn if the file has already been deleted.
        if (errno != ENOENT) {
          system.getDelegate().commandHadWarning(this, "cannot remove stale file '" + fileToDelete + "': " + strerror(errno) + "\n");
        }
      }
    }

    system.getDelegate().commandFinished(this, ProcessStatus::Succeeded);

    // Complete with a successful result.
    resultFn(BuildValue::makeStaleFileRemoval(expectedOutputs));
  }